

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

SIMDReplace * __thiscall
wasm::Builder::makeSIMDReplace
          (Builder *this,SIMDReplaceOp op,Expression *vec,uint8_t index,Expression *value)

{
  SIMDReplace *this_00;
  
  this_00 = MixedArena::alloc<wasm::SIMDReplace>(&this->wasm->allocator);
  this_00->op = op;
  this_00->vec = vec;
  this_00->index = index;
  this_00->value = value;
  SIMDReplace::finalize(this_00);
  return this_00;
}

Assistant:

SIMDReplace* makeSIMDReplace(SIMDReplaceOp op,
                               Expression* vec,
                               uint8_t index,
                               Expression* value) {
    auto* ret = wasm.allocator.alloc<SIMDReplace>();
    ret->op = op;
    ret->vec = vec;
    ret->index = index;
    ret->value = value;
    ret->finalize();
    return ret;
  }